

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O3

void rec_mm_comp(jit_State *J,RecordIndex *ix,int op)

{
  TRef TVar1;
  undefined4 uVar2;
  ulong uVar3;
  undefined4 uVar4;
  TValue TVar5;
  IRRef1 IVar6;
  int iVar7;
  TRef TVar8;
  TValue in_RAX;
  MMS mm;
  TValue mo1v;
  TValue local_38;
  
  ix->tab = ix->val;
  ix->tabv = ix->valv;
  local_38 = in_RAX;
  do {
    mm = MM_le - ((op & 2U) == 0);
    iVar7 = lj_record_mm_lookup(J,ix,mm);
    if (iVar7 != 0) {
      TVar1 = ix->mobj;
      local_38 = ix->mobjv;
      uVar3 = (ix->keyv).u64;
      if ((uVar3 & 0xffff800000000000) == 0xfff9800000000000) {
        if (ix->mtv == *(GCtab **)((uVar3 & 0x7fffffffffff) + 0x20)) {
          IVar6 = 0xb;
          goto LAB_00150b8e;
        }
      }
      else if (((uVar3 & 0xffff800000000000) == 0xfffa000000000000) &&
              (ix->mtv == *(GCtab **)((uVar3 & 0x7fffffffffff) + 0x20))) {
        IVar6 = 5;
LAB_00150b8e:
        TVar1 = ix->key;
        (J->fold).ins.field_0.ot = 0x450b;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
        (J->fold).ins.field_0.op2 = IVar6;
        TVar8 = lj_opt_fold(J);
        TVar1 = ix->mt;
        (J->fold).ins.field_0.ot = 0x88b;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar8;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar1;
        lj_opt_fold(J);
        goto LAB_00150bdc;
      }
      ix->tab = ix->key;
      (ix->tabv).u64 = uVar3;
      iVar7 = lj_record_mm_lookup(J,ix,mm);
      if ((iVar7 != 0) &&
         (iVar7 = lj_record_objcmp(J,TVar1,ix->mobj,&local_38,&ix->mobjv), iVar7 == 0)) {
LAB_00150bdc:
        rec_mm_callcomp(J,ix,op);
        return;
      }
    }
    if ((op & 2U) == 0) {
      return;
    }
    uVar2 = ix->key;
    uVar4 = ix->val;
    ix->tab = uVar2;
    ix->key = uVar4;
    ix->val = uVar2;
    TVar5 = ix->keyv;
    ix->tabv = TVar5;
    ix->keyv = ix->valv;
    ix->valv = TVar5;
    op = op ^ 3;
  } while( true );
}

Assistant:

static void rec_mm_comp(jit_State *J, RecordIndex *ix, int op)
{
  ix->tab = ix->val;
  copyTV(J->L, &ix->tabv, &ix->valv);
  while (1) {
    MMS mm = (op & 2) ? MM_le : MM_lt;  /* Try __le + __lt or only __lt. */
#if LJ_52
    if (!lj_record_mm_lookup(J, ix, mm)) {  /* Lookup mm on 1st operand. */
      ix->tab = ix->key;
      copyTV(J->L, &ix->tabv, &ix->keyv);
      if (!lj_record_mm_lookup(J, ix, mm))  /* Lookup mm on 2nd operand. */
	goto nomatch;
    }
    rec_mm_callcomp(J, ix, op);
    return;
#else
    if (lj_record_mm_lookup(J, ix, mm)) {  /* Lookup mm on 1st operand. */
      cTValue *bv;
      TRef mo1 = ix->mobj;
      TValue mo1v;
      copyTV(J->L, &mo1v, &ix->mobjv);
      /* Avoid the 2nd lookup and the objcmp if the metatables are equal. */
      bv = &ix->keyv;
      if (tvistab(bv) && tabref(tabV(bv)->metatable) == ix->mtv) {
	TRef mt2 = emitir(IRT(IR_FLOAD, IRT_TAB), ix->key, IRFL_TAB_META);
	emitir(IRTG(IR_EQ, IRT_TAB), mt2, ix->mt);
      } else if (tvisudata(bv) && tabref(udataV(bv)->metatable) == ix->mtv) {
	TRef mt2 = emitir(IRT(IR_FLOAD, IRT_TAB), ix->key, IRFL_UDATA_META);
	emitir(IRTG(IR_EQ, IRT_TAB), mt2, ix->mt);
      } else {  /* Lookup metamethod on 2nd operand and compare both. */
	ix->tab = ix->key;
	copyTV(J->L, &ix->tabv, bv);
	if (!lj_record_mm_lookup(J, ix, mm) ||
	    lj_record_objcmp(J, mo1, ix->mobj, &mo1v, &ix->mobjv))
	  goto nomatch;
      }
      rec_mm_callcomp(J, ix, op);
      return;
    }
#endif
  nomatch:
    /* Lookup failed. Retry with  __lt and swapped operands. */
    if (!(op & 2)) break;  /* Already at __lt. Interpreter will throw. */
    ix->tab = ix->key; ix->key = ix->val; ix->val = ix->tab;
    copyTV(J->L, &ix->tabv, &ix->keyv);
    copyTV(J->L, &ix->keyv, &ix->valv);
    copyTV(J->L, &ix->valv, &ix->tabv);
    op ^= 3;
  }
}